

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<float>::Reserve(RepeatedField<float> *this,int new_size)

{
  int iVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  unsigned_long uVar4;
  float *pfVar5;
  int in_ESI;
  int *in_RDI;
  float *limit;
  float *e;
  int old_total_size;
  size_t bytes;
  Arena *arena;
  Rep *new_rep;
  Rep *old_rep;
  size_t n;
  LogMessage *in_stack_fffffffffffffe18;
  int array_size;
  LogMessage *in_stack_fffffffffffffe20;
  Rep *in_stack_fffffffffffffe28;
  LogMessage *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  float *local_160;
  undefined8 *local_f0;
  undefined8 *local_70;
  LogMessage local_48;
  ulong local_10;
  LogMessage *local_8;
  
  if (in_RDI[1] < in_ESI) {
    if (0 < in_RDI[1]) {
      rep((RepeatedField<float> *)in_stack_fffffffffffffe20);
    }
    pLVar2 = (LogMessage *)GetArena((RepeatedField<float> *)in_stack_fffffffffffffe20);
    iVar1 = internal::CalculateReserveSize(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    uVar3 = (long)iVar1 * 4 + 8;
    if (pLVar2 == (LogMessage *)0x0) {
      local_f0 = (undefined8 *)operator_new(uVar3);
      array_size = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
    }
    else {
      uVar4 = std::numeric_limits<unsigned_long>::max();
      if (uVar4 < uVar3) {
        internal::LogMessage::LogMessage
                  (in_stack_fffffffffffffe30,(LogLevel)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                   (char *)in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20)
                  );
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        internal::LogMessage::~LogMessage((LogMessage *)0x430d03);
      }
      if (pLVar2 == (LogMessage *)0x0) {
        local_70 = (undefined8 *)operator_new__(uVar3);
        array_size = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
      }
      else {
        in_stack_fffffffffffffe30 = pLVar2;
        local_10 = uVar3;
        local_8 = pLVar2;
        uVar4 = std::numeric_limits<unsigned_long>::max();
        if (uVar4 < uVar3) {
          in_stack_fffffffffffffe20 = &local_48;
          internal::LogMessage::LogMessage
                    (in_stack_fffffffffffffe30,(LogLevel)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                     (char *)in_stack_fffffffffffffe20,
                     (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
          in_stack_fffffffffffffe28 =
               (Rep *)internal::LogMessage::operator<<
                                (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
          in_stack_fffffffffffffe18 =
               internal::LogMessage::operator<<
                         (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
          internal::LogFinisher::operator=
                    ((LogFinisher *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          internal::LogMessage::~LogMessage((LogMessage *)0x430e45);
        }
        internal::AlignUpTo8(local_10);
        internal::ArenaImpl::RecordAlloc
                  ((ArenaImpl *)in_stack_fffffffffffffe30,(type_info *)in_stack_fffffffffffffe28,
                   (size_t)in_stack_fffffffffffffe20);
        local_70 = (undefined8 *)
                   Arena::AllocateAlignedTo<1ul>
                             ((Arena *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
        array_size = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
      }
      local_f0 = local_70;
    }
    *local_f0 = pLVar2;
    in_RDI[1] = iVar1;
    *(undefined8 **)(in_RDI + 2) = local_f0 + 1;
    local_160 = elements((RepeatedField<float> *)
                         CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    pfVar5 = local_160 + in_RDI[1];
    for (; local_160 < pfVar5; local_160 = local_160 + 1) {
    }
    if (0 < *in_RDI) {
      elements((RepeatedField<float> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
              );
      MoveArray((RepeatedField<float> *)in_stack_fffffffffffffe30,(float *)in_stack_fffffffffffffe28
                ,(float *)in_stack_fffffffffffffe20,array_size);
    }
    InternalDeallocate((RepeatedField<float> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                       (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : NULL;
  Rep* new_rep;
  Arena* arena = GetArena();
  new_size = internal::CalculateReserveSize(total_size_, new_size);
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == NULL) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  // Already known: new_size >= internal::kMinRepeatedFieldAllocationSize
  // Maintain invariant:
  //     total_size_ == 0 ||
  //     total_size_ >= internal::kMinRepeatedFieldAllocationSize
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}